

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O2

timediff_t Curl_conn_shutdown_timeleft(connectdata *conn,curltime *nowp)

{
  timediff_t tVar1;
  long lVar2;
  long lVar3;
  anon_struct_40_2_458f30a3_for_shutdown *paVar4;
  ulong uVar5;
  bool bVar6;
  curltime cVar7;
  curltime local_40;
  
  paVar4 = &conn->shutdown;
  lVar3 = 0;
  for (uVar5 = 0; ((conn->shutdown).timeout_ms != 0 && (uVar5 < 2)); uVar5 = uVar5 + 1) {
    if (paVar4->start[0].tv_sec != 0) {
      if (nowp == (curltime *)0x0) {
        cVar7 = Curl_now();
        local_40.tv_sec = cVar7.tv_sec;
        local_40.tv_usec = cVar7.tv_usec;
        nowp = &local_40;
      }
      tVar1 = Curl_shutdown_timeleft(conn,(int)uVar5,nowp);
      if (tVar1 != 0) {
        lVar2 = lVar3;
        if (tVar1 < lVar3) {
          lVar2 = tVar1;
        }
        bVar6 = lVar3 == 0;
        lVar3 = lVar2;
        if (bVar6) {
          lVar3 = tVar1;
        }
      }
    }
    paVar4 = (anon_struct_40_2_458f30a3_for_shutdown *)(paVar4->start + 1);
  }
  return lVar3;
}

Assistant:

timediff_t Curl_conn_shutdown_timeleft(struct connectdata *conn,
                                       struct curltime *nowp)
{
  timediff_t left_ms = 0, ms;
  struct curltime now;
  int i;

  for(i = 0; conn->shutdown.timeout_ms && (i < 2); ++i) {
    if(!conn->shutdown.start[i].tv_sec)
      continue;
    if(!nowp) {
      now = Curl_now();
      nowp = &now;
    }
    ms = Curl_shutdown_timeleft(conn, i, nowp);
    if(ms && (!left_ms || ms < left_ms))
      left_ms = ms;
  }
  return left_ms;
}